

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

void __thiscall ParamNode::~ParamNode(ParamNode *this)

{
  ~ParamNode(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

ParamNode() : Node(NodeKind::ParamNode) { }